

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

size_t tinyexr::SaveEXRNPartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EXRAttribute *pEVar5;
  pointer pvVar6;
  long *plVar7;
  EXRTile *pEVar8;
  uchar **ppuVar9;
  pointer pvVar10;
  undefined8 uVar11;
  undefined4 *puVar12;
  int *piVar13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char **ppcVar20;
  byte bVar21;
  byte bVar22;
  bool bVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  char *pcVar27;
  ulong uVar28;
  size_type *psVar29;
  pointer pTVar30;
  size_t sVar31;
  EXRHeader *pEVar32;
  pointer pvVar33;
  uchar *puVar34;
  pointer pOVar35;
  pointer piVar36;
  undefined8 uVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  size_type sVar43;
  pointer pvVar44;
  int iVar45;
  unsigned_long uVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  ulong uVar50;
  _Alloc_hider _Var51;
  int iVar52;
  EXRHeader **ppEVar53;
  long lVar54;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar55;
  ulong uVar56;
  long lVar57;
  size_type sVar58;
  long lVar59;
  long lVar60;
  undefined1 *puVar61;
  pointer __dest;
  EXRImage *pEVar62;
  pointer puVar63;
  long lVar64;
  ulong __n;
  pointer puVar65;
  pointer puVar66;
  int j;
  ulong uVar67;
  bool bVar68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar69;
  string *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  char header [4];
  undefined1 auStack_224 [4];
  pointer pTStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  int local_208;
  int local_204;
  undefined8 local_200;
  uchar local_1f8;
  pointer local_1e8;
  EXRImage *local_1e0;
  char **local_1d8;
  pointer local_1d0;
  EXRHeader **local_1c8;
  ulong local_1c0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_1b8;
  allocator local_1a9;
  EXRHeader *local_1a8;
  ulong local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  long local_160;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  data_lists;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> chunk_count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> offset_data;
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  channels;
  
  if (memory_out == (uchar **)0x0 ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0)) {
    _header = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)header,"Invalid argument for SaveEXRNPartImageToMemory","");
    _Var51._M_p = _header;
    if (err != (char **)0x0) {
      pcVar27 = strdup(_header);
      *err = pcVar27;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var51._M_p != &local_218) {
LAB_001c2762:
      operator_delete(_Var51._M_p);
    }
    return (size_t)(pointer)0x0;
  }
  __n = (ulong)num_parts;
  local_1e0 = exr_images;
  local_1d8 = err;
  if (num_parts != 0) {
    uVar28 = 0;
    do {
      if (exr_headers[uVar28]->compression_type < 0) {
        _header = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)header,"Invalid argument for SaveEXRNPartImageToMemory","");
        ppcVar20 = local_1d8;
        _Var51._M_p = _header;
        if (local_1d8 != (char **)0x0) {
          pcVar27 = strdup(_header);
          *ppcVar20 = pcVar27;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var51._M_p == &local_218) {
          return (size_t)(pointer)0x0;
        }
        goto LAB_001c2762;
      }
      if (exr_headers[uVar28]->compression_type == 0x80) {
        _header = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)header,"ZFP compression is not supported in this build","");
        ppcVar20 = local_1d8;
        _Var51._M_p = _header;
        if (local_1d8 != (char **)0x0) {
          pcVar27 = strdup(_header);
          *ppcVar20 = pcVar27;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var51._M_p == &local_218) {
          return (size_t)(pointer)0x0;
        }
        goto LAB_001c2762;
      }
      uVar28 = uVar28 + 1;
    } while (__n != uVar28);
  }
  memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builtin_strncpy(header,"v/1\x01",4);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,0,header);
  header[0] = '\x02';
  header[1] = '\0';
  header[2] = '\0';
  header[3] = '\0';
  if ((num_parts == 1) && (local_1e0->tiles != (EXRTile *)0x0)) {
    header[0] = '\x02';
    header[1] = '\x02';
    bVar21 = 2;
  }
  else {
    bVar21 = 0;
  }
  bVar22 = bVar21;
  if ((*exr_headers)->long_name != 0) {
    bVar22 = bVar21 | 4;
    header._0_2_ = CONCAT11(bVar21,header[0]) | 0x400;
  }
  if (1 < num_parts) {
    header._0_2_ = CONCAT11(bVar22,header[0]) | 0x1000;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&memory,
             memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,header,auStack_224);
  std::vector<int,_std::allocator<int>_>::vector(&chunk_count,__n,(allocator_type *)header);
  std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::vector
            (&offset_data,__n,(allocator_type *)header);
  local_1e8 = (pointer)0x0;
  local_1c8 = exr_headers;
  if (num_parts != 0) {
    uVar28 = 0;
    iVar52 = 0;
    do {
      ppEVar53 = local_1c8;
      if (local_1e0[uVar28].tiles == (EXRTile *)0x0) {
        iVar24 = local_1c8[uVar28]->compression_type;
        iVar38 = 0x10;
        if ((iVar24 != 3) && (iVar24 != 0x80)) {
          if (iVar24 == 4) {
            iVar38 = 0x20;
          }
          else {
            iVar38 = 1;
          }
        }
        chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar28] = (local_1e0[uVar28].height + iVar38 + -1) / iVar38;
        InitSingleResolutionOffsets
                  (offset_data.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar28,
                   (long)chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar28]);
        iVar24 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar28];
      }
      else {
        _header = (undefined1  [16])0x0;
        local_218._M_allocated_capacity = 0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        PrecalculateTileInfo
                  ((vector<int,_std::allocator<int>_> *)header,&num_y_tiles,local_1c8[uVar28]);
        iVar24 = InitTileOffsets(offset_data.
                                 super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar28,ppEVar53[uVar28]
                                 ,(vector<int,_std::allocator<int>_> *)header,&num_y_tiles);
        chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar28] = iVar24;
        iVar24 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar28];
        if (num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer)_header != (pointer)0x0) {
          operator_delete(_header);
        }
      }
      iVar52 = iVar52 + iVar24;
      uVar28 = uVar28 + 1;
    } while (uVar28 != __n);
    local_1e8 = (pointer)((long)iVar52 << 3);
  }
  ppEVar53 = local_1c8;
  uVar41 = num_parts;
  std::
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  ::vector(&channels,__n,(allocator_type *)header);
  num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (num_parts == 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&num_y_tiles);
  }
  else {
    uVar28 = 0;
    do {
      data_lists.
      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      data_lists.
      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      data_lists.
      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pEVar32 = ppEVar53[uVar28];
      if (0 < pEVar32->num_channels) {
        lVar60 = 0;
        lVar54 = 0;
        do {
          pTStack_220 = (pointer)0x0;
          _header = (pointer)&local_218;
          local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
          local_1f8 = '\0';
          local_208 = pEVar32->pixel_types[lVar54];
          local_204 = pEVar32->requested_pixel_types[lVar54];
          local_200._0_4_ = 1;
          local_200._4_4_ = 1;
          std::__cxx11::string::string
                    ((string *)&channel_offset_list,pEVar32->channels->name + lVar60,&local_1a9);
          std::__cxx11::string::operator=((string *)header,(string *)&channel_offset_list);
          if ((pointer *)
              channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              &channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(channel_offset_list.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                    (channels.
                     super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar28,(value_type *)header);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_header != &local_218) {
            operator_delete(_header);
          }
          lVar54 = lVar54 + 1;
          pEVar32 = local_1c8[uVar28];
          lVar60 = lVar60 + 0x110;
        } while (lVar54 < pEVar32->num_channels);
      }
      pvVar33 = channels.
                super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar30 = channels.
                super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar28].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar54 = (long)channels.
                     super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar28].
                     super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar30;
      if (lVar54 == 0) {
        sVar58 = 1;
      }
      else {
        lVar54 = (lVar54 >> 3) * 0x6db6db6db6db6db7;
        lVar54 = lVar54 + (ulong)(lVar54 == 0);
        psVar29 = &(pTVar30->name)._M_string_length;
        lVar60 = 0;
        do {
          lVar57 = lVar60 + *psVar29;
          lVar60 = lVar57 + 0x11;
          psVar29 = psVar29 + 7;
          lVar54 = lVar54 + -1;
        } while (lVar54 != 0);
        sVar58 = lVar57 + 0x12;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data_lists,sVar58);
      if (data_lists.
          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          data_lists.
          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar54 = 0;
LAB_001c3df8:
        uVar37 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,0,lVar54);
        std::
        vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
        ::~vector(&channels);
        std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
                  (&offset_data);
        if (chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar37);
      }
      pvVar33 = pvVar33 + uVar28;
      pTVar30 = (pvVar33->
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>).
                _M_impl.super__Vector_impl_data._M_start;
      __dest = data_lists.
               super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar33->
          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>)._M_impl
          .super__Vector_impl_data._M_finish != pTVar30) {
        lVar54 = 0;
        uVar50 = 0;
        do {
          memcpy(__dest,*(void **)(pTVar30->pad + lVar54 + -0x31),
                 *(size_t *)(pTVar30->pad + lVar54 + -0x29));
          puVar61 = (undefined1 *)
                    ((long)&(__dest->
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                    *(long *)(((pvVar33->
                               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               )._M_impl.super__Vector_impl_data._M_start)->pad + lVar54 + -0x29));
          __dest = (pointer)(puVar61 + 0x11);
          *puVar61 = 0;
          pTVar30 = (pvVar33->
                    super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar37 = *(undefined8 *)(pTVar30->pad + lVar54 + -9);
          *(undefined4 *)(puVar61 + 1) = *(undefined4 *)(pTVar30->pad + lVar54 + -0xd);
          puVar61[5] = ((pvVar33->
                        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start)->pad[lVar54 + -1];
          *(undefined8 *)(puVar61 + 9) = uVar37;
          uVar50 = uVar50 + 1;
          pTVar30 = (pvVar33->
                    super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar54 = lVar54 + 0x38;
        } while (uVar50 < (ulong)(((long)(pvVar33->
                                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar30
                                  >> 3) * 0x6db6db6db6db6db7));
      }
      *(undefined1 *)
       &(__dest->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = 0;
      lVar54 = (long)data_lists.
                     super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)data_lists.
                     super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar54 == 0) goto LAB_001c3df8;
      WriteAttributeToMemory
                (&memory,"channels","chlist",
                 (uchar *)data_lists.
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(int)lVar54);
      ppEVar53 = local_1c8;
      if (data_lists.
          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(data_lists.
                        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      header = (char  [4])ppEVar53[uVar28]->compression_type;
      WriteAttributeToMemory(&memory,"compression","compression",(uchar *)header,1);
      pEVar62 = local_1e0;
      uVar1 = local_1e0[uVar28].width;
      uVar3 = local_1e0[uVar28].height;
      auVar19._4_4_ = uVar3 + -1;
      auVar19._0_4_ = uVar1 + -1;
      auVar19._8_8_ = 0;
      _header = auVar19 << 0x40;
      WriteAttributeToMemory(&memory,"dataWindow","box2i",(uchar *)header,0x10);
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uVar2 = pEVar62->width;
      uVar4 = pEVar62->height;
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar4 + -1,uVar2 + -1);
      WriteAttributeToMemory(&memory,"displayWindow","box2i",(uchar *)&channel_offset_list,0x10);
      auVar15[0xf] = 0;
      auVar15._0_15_ = stack0xfffffffffffffdd9;
      _header = auVar15 << 8;
      WriteAttributeToMemory(&memory,"lineOrder","lineOrder",(uchar *)header,1);
      header[0] = '\0';
      header[1] = '\0';
      header[2] = -0x80;
      header[3] = '?';
      WriteAttributeToMemory(&memory,"pixelAspectRatio","float",(uchar *)header,4);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pTStack_220;
      _header = auVar16 << 0x40;
      WriteAttributeToMemory(&memory,"screenWindowCenter","v2f",(uchar *)header,8);
      header[0] = '\0';
      header[1] = '\0';
      header[2] = -0x80;
      header[3] = '?';
      WriteAttributeToMemory(&memory,"screenWindowWidth","float",(uchar *)header,4);
      pEVar62 = local_1e0 + uVar28;
      if (pEVar62->tiles != (EXRTile *)0x0) {
        pEVar32 = ppEVar53[uVar28];
        bVar22 = (byte)pEVar32->tile_level_mode & 3;
        bVar21 = bVar22 + 0x10;
        if (pEVar32->tile_rounding_mode == 0) {
          bVar21 = bVar22;
        }
        pTStack_220._0_4_ = 0;
        pTStack_220._0_1_ = bVar21;
        header = (char  [4])pEVar32->tile_size_x;
        auStack_224 = (undefined1  [4])pEVar32->tile_size_y;
        WriteAttributeToMemory(&memory,"tiles","tiledesc",(uchar *)header,9);
      }
      if (1 < uVar41) {
        pEVar32 = ppEVar53[uVar28];
        sVar31 = strlen(pEVar32->name);
        if (sVar31 == 0) {
          _header = (pointer)&local_218;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)header,"Invalid \'name\' attribute for a multi-part file","");
          ppcVar20 = local_1d8;
          _Var51._M_p = _header;
          if (local_1d8 != (char **)0x0) {
            pcVar27 = strdup(_header);
            *ppcVar20 = pcVar27;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var51._M_p != &local_218) {
LAB_001c3d70:
            operator_delete(_Var51._M_p);
          }
        }
        else {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_emplace_unique<char_const(&)[256]>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&num_y_tiles,&pEVar32->name);
          if (uVar28 == 0xffffffffffffffff) {
            WriteAttributeToMemory(&memory,"name","string",(uchar *)ppEVar53[-1]->name,(int)sVar31);
            bVar68 = pEVar62->tiles == (EXRTile *)0x0;
            pcVar27 = "tiledimage";
            if (bVar68) {
              pcVar27 = "scanlineimage";
            }
            WriteAttributeToMemory(&memory,"type","string",(uchar *)pcVar27,(uint)bVar68 * 3 + 10);
            WriteAttributeToMemory
                      (&memory,"chunkCount","int",
                       (uchar *)(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + -1),4);
            goto LAB_001c2f5a;
          }
          _header = (pointer)&local_218;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)header,"\'name\' attributes must be unique for a multi-part file","")
          ;
          ppcVar20 = local_1d8;
          _Var51._M_p = _header;
          if (local_1d8 != (char **)0x0) {
            pcVar27 = strdup(_header);
            *ppcVar20 = pcVar27;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var51._M_p != &local_218) goto LAB_001c3d70;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&num_y_tiles);
        puVar63 = (pointer)0x0;
        goto LAB_001c3d88;
      }
LAB_001c2f5a:
      pEVar32 = ppEVar53[uVar28];
      if (0 < pEVar32->num_custom_attributes) {
        lVar54 = 0;
        lVar60 = 0;
        do {
          pEVar5 = pEVar32->custom_attributes;
          WriteAttributeToMemory
                    (&memory,pEVar5->name + lVar54,pEVar5->type + lVar54,
                     *(uchar **)((long)&pEVar5->value + lVar54),
                     *(int *)((long)&pEVar5->size + lVar54));
          lVar60 = lVar60 + 1;
          pEVar32 = ppEVar53[uVar28];
          lVar54 = lVar54 + 0x210;
        } while (lVar60 < pEVar32->num_custom_attributes);
      }
      auVar17[0xf] = 0;
      auVar17._0_15_ = stack0xfffffffffffffdd9;
      _header = auVar17 << 8;
      if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&memory,(iterator)
                           memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uchar *)header);
      }
      else {
        *memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish = '\0';
        memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != __n);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&num_y_tiles);
    if (1 < uVar41) {
      auVar18[0xf] = 0;
      auVar18._0_15_ = stack0xfffffffffffffdd9;
      _header = auVar18 << 8;
      if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&memory,(iterator)
                           memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uchar *)header);
      }
      else {
        *memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish = '\0';
        memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  puVar66 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar63 = memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::vector(&data_lists,__n,(allocator_type *)header);
  if (uVar41 != 0) {
    local_1e8 = puVar66 + ((long)local_1e8 - (long)puVar63);
    lVar54 = (ulong)(1 < uVar41) * 4;
    uVar28 = 0;
    puVar63 = (pointer)0x0;
    do {
      pEVar62 = local_1e0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((ulong)num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      pEVar32 = local_1c8[uVar28];
      iVar52 = pEVar32->compression_type;
      local_1c0 = 0x10;
      if ((iVar52 != 3) && (iVar52 != 0x80)) {
        if (iVar52 == 4) {
          local_1c0 = 0x20;
        }
        else {
          local_1c0 = 1;
        }
      }
      pvVar33 = channels.
                super__Vector_base<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar28;
      iVar52 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar28];
      sVar58 = (size_type)iVar52;
      local_1d0 = offset_data.
                  super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar28;
      pvVar55 = data_lists.
                super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar28;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::resize(pvVar55,sVar58);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&channel_offset_list,(long)pEVar32->num_channels,(allocator_type *)header);
      if (pEVar32->num_channels == 0) {
        iVar24 = 0;
      }
      else {
        iVar24 = 0;
        lVar60 = 0x24;
        uVar46 = 0;
        uVar50 = 0;
        do {
          channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar50] = uVar46;
          iVar38 = *(int *)(((pvVar33->
                             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start)->pad + lVar60 + -0x31);
          if ((iVar38 == 0) || (iVar38 == 2)) {
            iVar24 = iVar24 + 4;
            uVar46 = uVar46 + 4;
          }
          else if (iVar38 == 1) {
            iVar24 = iVar24 + 2;
            uVar46 = uVar46 + 2;
          }
          uVar50 = uVar50 + 1;
          lVar60 = lVar60 + 0x38;
        } while (uVar50 < (ulong)(long)pEVar32->num_channels);
      }
      pEVar62 = pEVar62 + uVar28;
      iVar38 = (int)pvVar33;
      local_1b8 = pvVar55;
      if (pEVar62->tiles == (EXRTile *)0x0) {
        plVar7 = *(long **)&(((local_1d0->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        local_1a8 = pEVar32;
        if (iVar52 < 1) {
LAB_001c3883:
          bVar68 = true;
          if (iVar52 == 0) goto LAB_001c38ca;
          lVar60 = 1;
          sVar43 = 0;
          puVar66 = local_1e8;
          do {
            *(pointer *)(*plVar7 + sVar43 * 8) = puVar66;
            pvVar10 = (local_1b8->
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            puVar66 = puVar66 + ((*(long *)((long)&(pvVar10->
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar60 * 8) +
                                 lVar54) - *(long *)((long)pvVar10 + lVar60 * 8 + -8));
            sVar43 = sVar43 + 1;
            lVar60 = lVar60 + 3;
          } while (sVar58 != sVar43);
        }
        else {
          local_1a0 = 0;
          bVar68 = false;
          do {
            lVar60 = local_1a0 * 0x18;
            iVar49 = ((int)local_1a0 + 1) * (int)local_1c0;
            iVar45 = (int)local_1a0 * (int)local_1c0;
            iVar39 = -iVar45;
            while( true ) {
              pvVar55 = local_1b8;
              local_1a0 = local_1a0 + 1;
              iVar40 = pEVar62->height;
              ppuVar9 = pEVar62->images;
              pvVar69 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c374c;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(((local_1b8->
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data + lVar60),8);
              if (iVar49 <= iVar40) {
                iVar40 = iVar49;
              }
              pvVar10 = (pvVar55->
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar37 = *(undefined8 *)
                        ((long)&(pvVar10->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data + lVar60);
              uVar11 = *(undefined8 *)
                        ((long)&(pvVar10->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data + lVar60 + 8);
              bVar23 = EncodePixelData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       ((long)&(pvVar10->
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               )._M_impl.super__Vector_impl_data + lVar60),ppuVar9,
                                       local_1a8->compression_type,pEVar62->width,pEVar62->width,
                                       iVar45,iVar40 + iVar39,iVar24,iVar38,
                                       (size_t)&channel_offset_list,
                                       (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                        *)&num_y_tiles,pvVar69,in_stack_fffffffffffffdb8,
                                       (void *)CONCAT44(uVar41,in_stack_fffffffffffffdc0));
              if (!bVar23) break;
              pvVar10 = (local_1b8->
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              piVar13 = *(int **)((long)&(pvVar10->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data + lVar60);
              iVar40 = *(int *)((long)&(pvVar10->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data + lVar60 + 8);
              *piVar13 = iVar45;
              *(int *)(*(long *)((long)&(((local_1b8->
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        )._M_impl.super__Vector_impl_data + lVar60) + 4) =
                   ((int)uVar37 + iVar40) - ((int)uVar11 + (int)piVar13);
              lVar60 = lVar60 + 0x18;
              iVar40 = (int)local_1c0;
              iVar49 = iVar49 + iVar40;
              iVar45 = iVar45 + iVar40;
              iVar39 = iVar39 - iVar40;
              if (local_1a0 == sVar58) {
                if (!bVar68) goto LAB_001c3883;
                goto LAB_001c386d;
              }
            }
            bVar68 = true;
          } while (local_1a0 != sVar58);
LAB_001c386d:
          std::__cxx11::string::append((char *)&num_y_tiles);
LAB_001c38fb:
          bVar68 = false;
          puVar66 = puVar63;
        }
      }
      else {
        iVar52 = 1;
        if (pEVar32->tile_level_mode == 2) {
          iVar52 = local_1d0->num_y_levels;
        }
        uVar25 = iVar52 * local_1d0->num_x_levels;
        if ((int)uVar25 < 1) {
LAB_001c38ca:
          bVar68 = true;
          puVar66 = local_1e8;
        }
        else {
          uVar50 = 0;
          local_160 = 0;
          pOVar35 = local_1d0;
          puVar65 = local_1e8;
          local_1a8 = pEVar32;
          do {
            if (pEVar62 == (EXRImage *)0x0) {
              std::__cxx11::string::append((char *)&num_y_tiles);
              goto LAB_001c38fb;
            }
            if (local_1a8->tile_level_mode == 2) {
              uVar26 = pEVar62->level_y * pOVar35->num_x_levels + pEVar62->level_x;
            }
            else {
              uVar26 = 0;
              if (local_1a8->tile_level_mode == 1) {
                uVar26 = pEVar62->level_x;
              }
            }
            if (uVar50 != uVar26) {
              std::__cxx11::string::append((char *)&num_y_tiles);
              goto LAB_001c38fb;
            }
            pvVar6 = (pOVar35->offsets).
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            plVar7 = *(long **)&pvVar6[uVar50].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl;
            lVar60 = plVar7[1];
            lVar57 = *plVar7;
            pTStack_220 = (pointer)0x0;
            _header = (pointer)&local_218;
            local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
            if ((((pEVar62->width < local_1a8->tile_size_x) ||
                 (pEVar62->height < local_1a8->tile_size_y)) && (pEVar62->level_x == 0)) &&
               (pEVar62->level_y == 0)) {
LAB_001c3572:
              std::__cxx11::string::append(header);
              pOVar35 = local_1d0;
              if (pTStack_220 != (pointer)0x0) {
                std::__cxx11::string::_M_append((char *)&num_y_tiles,(ulong)_header);
              }
              bVar68 = false;
            }
            else {
              lVar47 = ((long)*(pointer *)
                               ((long)&pvVar6[uVar50].
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl + 8) - (long)plVar7 >> 3) * -0x5555555555555555;
              local_1c0 = (ulong)(lVar60 - lVar57) >> 3;
              uVar26 = (int)local_1c0 * (int)lVar47;
              if (0 < (int)uVar26) {
                uVar56 = 0;
                bVar68 = false;
                do {
                  uVar67 = uVar56 << 5 | 0x18;
                  lVar64 = (local_160 + uVar56) * 0x18;
                  uVar42 = uVar56;
                  while( true ) {
                    pvVar55 = local_1b8;
                    lVar48 = (long)(int)local_1c0;
                    uVar56 = (ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 | uVar42 & 0xffffffff;
                    local_1a0 = CONCAT44(local_1a0._4_4_,(int)((long)uVar56 / lVar48));
                    pEVar8 = pEVar62->tiles;
                    ppuVar9 = *(uchar ***)((long)&pEVar8->offset_x + uVar67);
                    pvVar69 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c3429;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&(((local_1b8->
                                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data + lVar64),0x14);
                    pvVar10 = (pvVar55->
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    uVar37 = *(undefined8 *)
                              ((long)&(pvVar10->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data + lVar64);
                    uVar11 = *(undefined8 *)
                              ((long)&(pvVar10->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data + lVar64 + 8);
                    bVar23 = EncodePixelData((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)((long)&(pvVar10->
                                                                                                                
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar64),
                                             ppuVar9,local_1a8->compression_type,
                                             *(int *)((long)pEVar8 + (uVar67 - 8)),
                                             local_1a8->tile_size_x,0,
                                             *(int *)((long)pEVar8 + (uVar67 - 4)),iVar24,iVar38,
                                             (size_t)&channel_offset_list,
                                             (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                              *)header,pvVar69,in_stack_fffffffffffffdb8,
                                             (void *)CONCAT44(uVar41,in_stack_fffffffffffffdc0));
                    if (!bVar23) break;
                    pvVar10 = (local_1b8->
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    puVar12 = *(undefined4 **)
                               ((long)&(pvVar10->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data + lVar64);
                    iVar52 = *(int *)((long)&(pvVar10->
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             )._M_impl.super__Vector_impl_data + lVar64 + 8);
                    *puVar12 = (int)((long)uVar56 % lVar48);
                    *(undefined4 *)
                     (*(long *)((long)&(((local_1b8->
                                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data + lVar64) + 4) =
                         (undefined4)local_1a0;
                    *(int *)(*(long *)((long)&(((local_1b8->
                                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data + lVar64) + 8) =
                         pEVar62->level_x;
                    *(int *)(*(long *)((long)&(((local_1b8->
                                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data + lVar64) + 0xc) =
                         pEVar62->level_y;
                    *(int *)(*(long *)((long)&(((local_1b8->
                                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data + lVar64) + 0x10) =
                         ((int)uVar37 + iVar52) - ((int)uVar11 + (int)puVar12);
                    uVar42 = uVar42 + 1;
                    uVar67 = uVar67 + 0x20;
                    lVar64 = lVar64 + 0x18;
                    if (uVar26 == uVar42) {
                      if (!bVar68) goto LAB_001c35b3;
                      goto LAB_001c3572;
                    }
                  }
                  uVar56 = uVar42 + 1;
                  bVar68 = true;
                } while ((ulong)uVar26 - 1 != uVar42);
                goto LAB_001c3572;
              }
LAB_001c35b3:
              lVar47 = lVar47 << 0x20;
              if (lVar47 != 0) {
                lVar47 = lVar47 >> 0x20;
                lVar64 = 0;
                do {
                  if ((lVar60 - lVar57 & 0x7ffffffffU) != 0) {
                    lVar48 = local_160 * 3 + 1;
                    lVar59 = 0;
                    do {
                      *(pointer *)
                       (*(long *)(*(long *)&(local_1d0->offsets).
                                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar50].
                                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            ._M_impl + lVar64 * 0x18) + lVar59 * 8) = puVar65;
                      pvVar10 = (local_1b8->
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      puVar65 = puVar65 + ((*(long *)((long)&(pvVar10->
                                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar48 * 8) +
                                           lVar54) - *(long *)((long)pvVar10 + lVar48 * 8 + -8));
                      lVar59 = lVar59 + 1;
                      lVar48 = lVar48 + 3;
                    } while ((long)(int)local_1c0 + (ulong)((long)(int)local_1c0 == 0) != lVar59);
                    local_160 = local_160 + lVar59;
                  }
                  lVar64 = lVar64 + 1;
                } while (lVar64 != lVar47 + (ulong)(lVar47 == 0));
              }
              pEVar62 = pEVar62->next_level;
              bVar68 = true;
              pOVar35 = local_1d0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_header != &local_218) {
              operator_delete(_header);
            }
            puVar66 = puVar63;
          } while ((bVar68) && (uVar50 = uVar50 + 1, puVar66 = puVar65, uVar50 != uVar25));
        }
      }
      puVar63 = puVar66;
      if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(channel_offset_list.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar36 = num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar66 = puVar63;
      if (((!bVar68) && (puVar66 = local_1e8, local_1d8 != (char **)0x0)) &&
         (num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish != (pointer)0x0)) {
        pcVar27 = strdup((char *)num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        *local_1d8 = pcVar27;
        puVar66 = local_1e8;
      }
      local_1e8 = puVar66;
      if ((pointer *)piVar36 !=
          &num_y_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage) {
        operator_delete(piVar36);
      }
      if (!bVar68) goto LAB_001c3ccb;
      uVar28 = uVar28 + 1;
    } while (uVar28 != __n);
    if (puVar63 != (pointer)0x0) {
      uVar25 = uVar41;
      puVar34 = (uchar *)malloc((size_t)puVar63);
      *memory_out = puVar34;
      sVar31 = (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      memcpy(puVar34,memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar31);
      if (uVar41 != 0) {
        puVar34 = puVar34 + sVar31;
        uVar28 = 0;
        do {
          if (local_1e0[uVar28].tiles == (EXRTile *)0x0) {
            iVar52 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar28];
            memcpy(puVar34,(void *)**(undefined8 **)
                                     &((offset_data.
                                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar28].offsets.
                                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      )._M_impl,(long)iVar52 * 8);
            puVar34 = puVar34 + (long)iVar52 * 8;
          }
          else {
            if (local_1c8[uVar28]->tile_level_mode == 2) {
              uVar41 = offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar28].num_y_levels *
                       offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar28].num_x_levels;
            }
            else {
              uVar41 = offset_data.
                       super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar28].num_x_levels;
            }
            if (0 < (int)uVar41) {
              local_1a0 = (ulong)uVar41;
              uVar50 = 0;
              pOVar35 = offset_data.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pvVar6 = pOVar35[uVar28].offsets.
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar44 = *(pointer *)
                           &pvVar6[uVar50].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl;
                if (*(pointer *)
                     ((long)&pvVar6[uVar50].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl + 8) != pvVar44) {
                  lVar54 = 8;
                  uVar56 = 0;
                  do {
                    pvVar14 = *(void **)((long)pvVar44 + lVar54 + -8);
                    sVar31 = *(long *)((long)&(pvVar44->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl + lVar54) - (long)pvVar14;
                    memcpy(puVar34,pvVar14,sVar31);
                    puVar34 = puVar34 + sVar31;
                    uVar56 = uVar56 + 1;
                    pvVar6 = offset_data.
                             super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar28].offsets.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pvVar44 = *(pointer *)
                               &pvVar6[uVar50].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl;
                    lVar54 = lVar54 + 0x18;
                    pOVar35 = offset_data.
                              super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  } while (uVar56 < (ulong)(((long)*(pointer *)
                                                    ((long)&pvVar6[uVar50].
                                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) - (long)pvVar44 >> 3) *
                                           -0x5555555555555555));
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_1a0);
            }
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != __n);
        if (uVar25 != 0) {
          uVar28 = 0;
          piVar36 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            if (piVar36[uVar28] != 0) {
              lVar54 = 8;
              uVar50 = 0;
              do {
                if (1 < uVar25) {
                  *(int *)puVar34 = (int)uVar28;
                  puVar34 = puVar34 + 4;
                }
                pvVar10 = data_lists.
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar28].
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar14 = *(void **)((long)pvVar10 + lVar54 + -8);
                memcpy(puVar34,pvVar14,
                       *(long *)((long)&(pvVar10->
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        )._M_impl.super__Vector_impl_data + lVar54) - (long)pvVar14)
                ;
                pvVar10 = data_lists.
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar28].
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar34 = puVar34 + (*(long *)((long)&(pvVar10->
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data + lVar54) -
                                    *(long *)((long)pvVar10 + lVar54 + -8));
                uVar50 = uVar50 + 1;
                lVar54 = lVar54 + 0x18;
                piVar36 = chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              } while (uVar50 < (ulong)(long)chunk_count.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar28]);
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != __n);
        }
      }
      goto LAB_001c3cce;
    }
  }
  _header = (pointer)&local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)header,"Output memory size is zero","");
  ppcVar20 = local_1d8;
  _Var51._M_p = _header;
  if (local_1d8 != (char **)0x0) {
    pcVar27 = strdup(_header);
    *ppcVar20 = pcVar27;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var51._M_p != &local_218) {
    operator_delete(_Var51._M_p);
  }
LAB_001c3ccb:
  puVar63 = (pointer)0x0;
LAB_001c3cce:
  std::
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::~vector(&data_lists);
LAB_001c3d88:
  std::
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  ::~vector(&channels);
  std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&offset_data);
  if (chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(chunk_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return (size_t)puVar63;
}

Assistant:

static size_t SaveEXRNPartImageToMemory(const EXRImage* exr_images,
                                        const EXRHeader** exr_headers,
                                        unsigned int num_parts,
                                        unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory_out == NULL) {
    SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                    err);
    return 0;
  }
  {
    for (unsigned int i = 0; i < num_parts; ++i) {
      if (exr_headers[i]->compression_type < 0) {
        SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                        err);
        return 0;
      }
#if !TINYEXR_USE_PIZ
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
        SetErrorMessage("PIZ compression is not supported in this build",
                        err);
        return 0;
      }
#endif
#if !TINYEXR_USE_ZFP
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
        SetErrorMessage("ZFP compression is not supported in this build",
                        err);
        return 0;
      }
#else
      for (int c = 0; c < exr_header->num_channels; ++c) {
        if (exr_headers[i]->requested_pixel_types[c] != TINYEXR_PIXELTYPE_FLOAT) {
          SetErrorMessage("Pixel type must be FLOAT for ZFP compression",
                          err);
          return 0;
        }
      }
#endif
    }
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = { 0x76, 0x2f, 0x31, 0x01 };
    memory.insert(memory.end(), header, header + 4);
  }

  // Version
  // using value from the first header
  int long_name = exr_headers[0]->long_name;
  {
    char marker[] = { 2, 0, 0, 0 };
    /* @todo
    if (exr_header->non_image) {
    marker[1] |= 0x8;
    }
    */
    // tiled
    if (num_parts == 1 && exr_images[0].tiles) {
      marker[1] |= 0x2;
    }
    // long_name
    if (long_name) {
      marker[1] |= 0x4;
    }
    // multipart
    if (num_parts > 1) {
      marker[1] |= 0x10;
    }
    memory.insert(memory.end(), marker, marker + 4);
  }

  int total_chunk_count = 0;
  std::vector<int> chunk_count(num_parts);
  std::vector<OffsetData> offset_data(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (!exr_images[i].tiles) {
      int num_scanlines = NumScanlines(exr_headers[i]->compression_type);
      chunk_count[i] =
        (exr_images[i].height + num_scanlines - 1) / num_scanlines;
      InitSingleResolutionOffsets(offset_data[i], chunk_count[i]);
      total_chunk_count += chunk_count[i];
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        chunk_count[i] =
          InitTileOffsets(offset_data[i], exr_headers[i], num_x_tiles, num_y_tiles);
        total_chunk_count += chunk_count[i];
      }
    }
  }
  // Write attributes to memory buffer.
  std::vector< std::vector<tinyexr::ChannelInfo> > channels(num_parts);
  {
    std::set<std::string> partnames;
    for (unsigned int i = 0; i < num_parts; ++i) {
      //channels
      {
        std::vector<unsigned char> data;

        for (int c = 0; c < exr_headers[i]->num_channels; c++) {
          tinyexr::ChannelInfo info;
          info.p_linear = 0;
          info.pixel_type = exr_headers[i]->pixel_types[c];
          info.requested_pixel_type = exr_headers[i]->requested_pixel_types[c];
          info.x_sampling = 1;
          info.y_sampling = 1;
          info.name = std::string(exr_headers[i]->channels[c].name);
          channels[i].push_back(info);
        }

        tinyexr::WriteChannelInfo(data, channels[i]);

        tinyexr::WriteAttributeToMemory(&memory, "channels", "chlist", &data.at(0),
                                        static_cast<int>(data.size()));
      }

      {
        int comp = exr_headers[i]->compression_type;
        swap4(&comp);
        WriteAttributeToMemory(
          &memory, "compression", "compression",
          reinterpret_cast<const unsigned char*>(&comp), 1);
      }

      {
        int data[4] = { 0, 0, exr_images[i].width - 1, exr_images[i].height - 1 };
        swap4(&data[0]);
        swap4(&data[1]);
        swap4(&data[2]);
        swap4(&data[3]);
        WriteAttributeToMemory(
          &memory, "dataWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data), sizeof(int) * 4);

        int data0[4] = { 0, 0, exr_images[0].width - 1, exr_images[0].height - 1 };
        swap4(&data0[0]);
        swap4(&data0[1]);
        swap4(&data0[2]);
        swap4(&data0[3]);
        // Note: must be the same across parts (currently, using value from the first header)
        WriteAttributeToMemory(
          &memory, "displayWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data0), sizeof(int) * 4);
      }

      {
        unsigned char line_order = 0;  // @fixme { read line_order from EXRHeader }
        WriteAttributeToMemory(&memory, "lineOrder", "lineOrder",
                               &line_order, 1);
      }

      {
        // Note: must be the same across parts
        float aspectRatio = 1.0f;
        swap4(&aspectRatio);
        WriteAttributeToMemory(
          &memory, "pixelAspectRatio", "float",
          reinterpret_cast<const unsigned char*>(&aspectRatio), sizeof(float));
      }

      {
        float center[2] = { 0.0f, 0.0f };
        swap4(&center[0]);
        swap4(&center[1]);
        WriteAttributeToMemory(
          &memory, "screenWindowCenter", "v2f",
          reinterpret_cast<const unsigned char*>(center), 2 * sizeof(float));
      }

      {
        float w = 1.0f;
        swap4(&w);
        WriteAttributeToMemory(&memory, "screenWindowWidth", "float",
                               reinterpret_cast<const unsigned char*>(&w),
                               sizeof(float));
      }

      if (exr_images[i].tiles) {
        unsigned char tile_mode = static_cast<unsigned char>(exr_headers[i]->tile_level_mode & 0x3);
        if (exr_headers[i]->tile_rounding_mode) tile_mode |= (1u << 4u);
        //unsigned char data[9] = { 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        unsigned int datai[3] = { 0, 0, 0 };
        unsigned char* data = reinterpret_cast<unsigned char*>(&datai[0]);
        datai[0] = static_cast<unsigned int>(exr_headers[i]->tile_size_x);
        datai[1] = static_cast<unsigned int>(exr_headers[i]->tile_size_y);
        data[8] = tile_mode;
        swap4(reinterpret_cast<unsigned int*>(&data[0]));
        swap4(reinterpret_cast<unsigned int*>(&data[4]));
        WriteAttributeToMemory(
          &memory, "tiles", "tiledesc",
          reinterpret_cast<const unsigned char*>(data), 9);
      }

      // must be present for multi-part files - according to spec.
      if (num_parts > 1) {
        // name
        {
          size_t len = 0;
          if ((len = strlen(exr_headers[i]->name)) > 0) {
            partnames.emplace(exr_headers[i]->name);
            if (partnames.size() != i + 1) {
              SetErrorMessage("'name' attributes must be unique for a multi-part file", err);
              return 0;
            }
            WriteAttributeToMemory(
              &memory, "name", "string",
              reinterpret_cast<const unsigned char*>(exr_headers[i]->name),
              static_cast<int>(len));
          } else {
            SetErrorMessage("Invalid 'name' attribute for a multi-part file", err);
            return 0;
          }
        }
        // type
        {
          const char* type = "scanlineimage";
          if (exr_images[i].tiles) type = "tiledimage";
          WriteAttributeToMemory(
            &memory, "type", "string",
            reinterpret_cast<const unsigned char*>(type),
            static_cast<int>(strlen(type)));
        }
        // chunkCount
        {
          WriteAttributeToMemory(
            &memory, "chunkCount", "int",
            reinterpret_cast<const unsigned char*>(&chunk_count[i]),
            4);
        }
      }

      // Custom attributes
      if (exr_headers[i]->num_custom_attributes > 0) {
        for (int j = 0; j < exr_headers[i]->num_custom_attributes; j++) {
          tinyexr::WriteAttributeToMemory(
            &memory, exr_headers[i]->custom_attributes[j].name,
            exr_headers[i]->custom_attributes[j].type,
            reinterpret_cast<const unsigned char*>(
              exr_headers[i]->custom_attributes[j].value),
            exr_headers[i]->custom_attributes[j].size);
        }
      }

      {  // end of header
        memory.push_back(0);
      }
    }
  }
  if (num_parts > 1) {
    // end of header list
    memory.push_back(0);
  }

  tinyexr_uint64 chunk_offset = memory.size() + size_t(total_chunk_count) * sizeof(tinyexr_uint64);

  tinyexr_uint64 total_size = 0;
  std::vector< std::vector< std::vector<unsigned char> > > data_lists(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    std::string e;
    int ret = EncodeChunk(&exr_images[i], exr_headers[i],
                          channels[i],
                          chunk_count[i],
                          // starting offset of current chunk after part-number
                          chunk_offset,
                          num_parts > 1,
                          offset_data[i], // output: block offsets, must be initialized
                          data_lists[i], // output
                          total_size, // output
                          &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return 0;
    }
    chunk_offset = total_size;
  }

  // Allocating required memory
  if (total_size == 0) { // something went wrong
    tinyexr::SetErrorMessage("Output memory size is zero", err);
    return 0;
  }
  (*memory_out) = static_cast<unsigned char*>(malloc(size_t(total_size)));

  // Writing header
  memcpy((*memory_out), &memory[0], memory.size());
  unsigned char* memory_ptr = *memory_out + memory.size();
  size_t sum = memory.size();
  ((void)(sum));

  // Writing offset data for chunks
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (exr_images[i].tiles) {
      const EXRImage* level_image = &exr_images[i];
      int num_levels = (exr_headers[i]->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) ?
        offset_data[i].num_x_levels : (offset_data[i].num_x_levels * offset_data[i].num_y_levels);
      for (int level_index = 0; level_index < num_levels; ++level_index) {
        for (size_t j = 0; j < offset_data[i].offsets[level_index].size(); ++j) {
          size_t num_bytes = sizeof(tinyexr_uint64) * offset_data[i].offsets[level_index][j].size();
          sum += num_bytes;
          assert(sum <= total_size);
          memcpy(memory_ptr,
                 reinterpret_cast<unsigned char*>(&offset_data[i].offsets[level_index][j][0]),
                 num_bytes);
          memory_ptr += num_bytes;
        }
        level_image = level_image->next_level;
      }
    } else {
      size_t num_bytes = sizeof(tinyexr::tinyexr_uint64) * static_cast<size_t>(chunk_count[i]);
      sum += num_bytes;
      assert(sum <= total_size);
      std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data[i].offsets[0][0];
      memcpy(memory_ptr, reinterpret_cast<unsigned char*>(&offsets[0]), num_bytes);
      memory_ptr += num_bytes;
    }
  }

  // Writing chunk data
  for (unsigned int i = 0; i < num_parts; ++i) {
    for (size_t j = 0; j < static_cast<size_t>(chunk_count[i]); ++j) {
      if (num_parts > 1) {
        sum += 4;
        assert(sum <= total_size);
        unsigned int part_number = i;
        swap4(&part_number);
        memcpy(memory_ptr, &part_number, 4);
        memory_ptr += 4;
      }
      sum += data_lists[i][j].size();
      assert(sum <= total_size);
      memcpy(memory_ptr, &data_lists[i][j][0], data_lists[i][j].size());
      memory_ptr += data_lists[i][j].size();
    }
  }
  assert(sum == total_size);
  return size_t(total_size);  // OK
}